

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaxDrawBuffersIndexedTest::iterate
          (MaxDrawBuffersIndexedTest *this)

{
  TestLog *log;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  BlendState preCommonBlendState;
  Random rng;
  ResultCollector results;
  BlendState postCommonBlendState;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  local_168;
  undefined1 local_148 [48];
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_118;
  Vector<bool,_4> *local_f0;
  deRandom local_e0;
  ResultCollector local_d0;
  BlendState local_80;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,0x1b32ab9);
  tcu::ResultCollector::ResultCollector(&local_d0,log,(string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  deRandom_init(&local_e0,this->m_seed);
  local_148._0_8_ = (pointer)0x0;
  local_148._16_8_ = (undefined1 *)0x0;
  local_118 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
               *)0x0;
  local_f0 = (Vector<bool,_4> *)0x0;
  local_80.enableBlend.m_ptr = (bool *)0x0;
  local_80.blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
  ;
  local_80.blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_80.colorMask.m_ptr = (Vector<bool,_4> *)0x0;
  local_168.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  genRandomTest((Random *)&local_e0,(BlendState *)local_148,&local_80,&local_168,4,
                (this->super_TestCase).m_context);
  anon_unknown_0::runTest
            (log,&local_d0,((this->super_TestCase).m_context)->m_renderCtx,(BlendState *)local_148,
             &local_80,&local_168);
  tcu::ResultCollector::setTestContextResult
            (&local_d0,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::~vector(&local_168);
  if (local_80.blendFunc.m_ptr !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    (local_80.blendFunc.m_ptr)->m_isFirst = true;
    ((local_80.blendFunc.m_ptr)->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_80.blendEq.m_ptr !=
      (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0)
  {
    (local_80.blendEq.m_ptr)->m_isFirst = true;
    ((local_80.blendEq.m_ptr)->field_1).m_first = (uint *)0x0;
  }
  if (local_118 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_118->m_isFirst = true;
    (local_118->field_1).m_first = (BlendFunc *)0x0;
  }
  if ((undefined1 *)local_148._16_8_ != (undefined1 *)0x0) {
    *(undefined1 *)local_148._16_8_ = 1;
    *(undefined8 *)(local_148._16_8_ + 8) = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_message._M_dataplus._M_p != &local_d0.m_message.field_2) {
    operator_delete(local_d0.m_message._M_dataplus._M_p,
                    local_d0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_prefix._M_dataplus._M_p != &local_d0.m_prefix.field_2) {
    operator_delete(local_d0.m_prefix._M_dataplus._M_p,
                    local_d0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

TestCase::IterateResult MaxDrawBuffersIndexedTest::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	tcu::ResultCollector	results					(log);
	de::Random				rng						(m_seed);
	BlendState				preCommonBlendState;
	BlendState				postCommonBlendState;
	vector<DrawBufferInfo>	drawBuffers;

	genRandomTest(rng, preCommonBlendState, postCommonBlendState, drawBuffers, 4, m_context);

	runTest(log, results, m_context.getRenderContext(), preCommonBlendState, postCommonBlendState, drawBuffers);

	results.setTestContextResult(m_testCtx);

	return STOP;
}